

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

void Of_CutParams(Of_Man_t *p,Of_Cut_t *pCut,int nGiaRefs)

{
  uint nLeaves_00;
  int iVar1;
  int iVar2;
  int local_34;
  int local_20;
  int nLeaves;
  int i;
  int nGiaRefs_local;
  Of_Cut_t *pCut_local;
  Of_Man_t *p_local;
  
  nLeaves_00 = *(uint *)&pCut->field_0x10 >> 0x1b;
  if (p->pPars->nLutSize < (int)nLeaves_00) {
    __assert_fail("nLeaves <= p->pPars->nLutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                  ,0x2a1,"void Of_CutParams(Of_Man_t *, Of_Cut_t *, int)");
  }
  pCut->Delay = 0;
  pCut->Flow = 0;
  for (local_20 = 0; local_20 < (int)nLeaves_00; local_20 = local_20 + 1) {
    iVar2 = pCut->Delay;
    iVar1 = Of_ObjCutDelay(p,pCut->pLeaves[local_20]);
    iVar2 = Abc_MaxInt(iVar2,iVar1);
    pCut->Delay = iVar2;
    iVar2 = Of_ObjCutFlow(p,pCut->pLeaves[local_20]);
    pCut->Flow = iVar2 + pCut->Flow;
  }
  pCut->Delay = (uint)(1 < nLeaves_00) + pCut->Delay;
  iVar2 = pCut->Flow;
  iVar1 = Of_CutArea(p,nLeaves_00);
  local_34 = nGiaRefs;
  if (nGiaRefs == 0) {
    local_34 = 1;
  }
  pCut->Flow = (iVar2 + iVar1 * 100) / local_34;
  return;
}

Assistant:

static inline void Of_CutParams( Of_Man_t * p, Of_Cut_t * pCut, int nGiaRefs )
{
    int i, nLeaves = pCut->nLeaves; 
    assert( nLeaves <= p->pPars->nLutSize );
    pCut->Delay = 0;
    pCut->Flow  = 0;
    for ( i = 0; i < nLeaves; i++ )
    {
        pCut->Delay = Abc_MaxInt( pCut->Delay, Of_ObjCutDelay(p, pCut->pLeaves[i]) );
        pCut->Flow += Of_ObjCutFlow(p, pCut->pLeaves[i]);
    }
    pCut->Delay += (int)(nLeaves > 1);
    pCut->Flow = (pCut->Flow + 100 * Of_CutArea(p, nLeaves)) / (nGiaRefs ? nGiaRefs : 1);
}